

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMouseDragging(int button,float lock_threshold)

{
  if (4 < (uint)button) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x126e,"bool ImGui::IsMouseDragging(int, float)");
  }
  if ((GImGui->IO).MouseDown[(uint)button] == true) {
    if (lock_threshold < 0.0) {
      lock_threshold = (GImGui->IO).MouseDragThreshold;
    }
    return lock_threshold * lock_threshold <= (GImGui->IO).MouseDragMaxDistanceSqr[(uint)button];
  }
  return false;
}

Assistant:

bool ImGui::IsMouseDragging(int button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button])
        return false;
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    return g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold;
}